

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O2

bool deqp::gles31::Functional::containsAfterUintCast
               (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *haystack,
               deInt32 needle,Precision precision)

{
  bool bVar1;
  _Rb_tree_header *p_Var2;
  _Base_ptr p_Var3;
  
  p_Var2 = &(haystack->_M_t)._M_impl.super__Rb_tree_header;
  for (p_Var3 = (haystack->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != p_Var2; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    bVar1 = intEqualsAfterUintCast(needle,p_Var3[1]._M_color,precision);
    if (bVar1) break;
  }
  return (_Rb_tree_header *)p_Var3 != p_Var2;
}

Assistant:

static bool containsAfterUintCast (const std::set<deUint32>& haystack, deInt32 needle, glu::Precision precision)
{
	for (std::set<deUint32>::const_iterator it = haystack.begin(); it != haystack.end(); ++it)
		if (intEqualsAfterUintCast(needle, *it, precision))
			return true;
	return false;
}